

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

string * __thiscall
duckdb_parquet::to_string_abi_cxx11_(string *__return_storage_ptr__,duckdb_parquet *this,type *val)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  undefined *puVar4;
  ulong uVar5;
  string *__str;
  undefined *puVar6;
  uint __len;
  allocator local_21;
  
  uVar1 = *(uint *)this;
  puVar4 = &DAT_02536ec0;
  if (DAT_02536ec8 != (undefined *)0x0) {
    puVar4 = &DAT_02536ec0;
    puVar6 = DAT_02536ec8;
    do {
      if ((int)uVar1 <= *(int *)(puVar6 + 0x20)) {
        puVar4 = puVar6;
      }
      puVar6 = *(undefined **)(puVar6 + (ulong)(*(int *)(puVar6 + 0x20) < (int)uVar1) * 8 + 0x10);
    } while (puVar6 != (undefined *)0x0);
  }
  puVar6 = &DAT_02536ec0;
  if ((puVar4 != &DAT_02536ec0) && (puVar6 = &DAT_02536ec0, *(int *)(puVar4 + 0x20) <= (int)uVar1))
  {
    puVar6 = puVar4;
  }
  if (puVar6 == &DAT_02536ec0) {
    __val = -uVar1;
    if (0 < (int)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar5 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar3 = (uint)uVar5;
        if (uVar3 < 100) {
          __len = __len - 2;
          goto LAB_01ccab8d;
        }
        if (uVar3 < 1000) {
          __len = __len - 1;
          goto LAB_01ccab8d;
        }
        if (uVar3 < 10000) goto LAB_01ccab8d;
        uVar5 = uVar5 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar3);
      __len = __len + 1;
    }
LAB_01ccab8d:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar1 >> 0x1f),__len,__val);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,*(char **)(puVar6 + 0x28),&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const BoundaryOrder::type& val) {
  std::map<int, const char*>::const_iterator it = _BoundaryOrder_VALUES_TO_NAMES.find(val);
  if (it != _BoundaryOrder_VALUES_TO_NAMES.end()) {
    return std::string(it->second);
  } else {
    return std::to_string(static_cast<int>(val));
  }
}